

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  int iVar5;
  undefined1 (*pauVar6) [64];
  int iVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM3 [64];
  
  uVar1 = a->c;
  iVar5 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar2 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar2 = 0;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = 0;
    }
    for (uVar3 = 0; uVar3 != uVar9; uVar3 = uVar3 + 1) {
      pauVar4 = (undefined1 (*) [64])(a->cstep * uVar3 * a->elemsize + (long)a->data);
      pauVar6 = (undefined1 (*) [64])(c->cstep * uVar3 * c->elemsize + (long)c->data);
      fVar11 = 1.0 / *b->data;
      auVar10 = vbroadcastss_avx512f(ZEXT416((uint)fVar11));
      for (iVar7 = 0; iVar7 + 0xf < iVar5; iVar7 = iVar7 + 0x10) {
        in_ZMM3 = vmulps_avx512f(auVar10,*pauVar4);
        *pauVar6 = in_ZMM3;
        pauVar4 = pauVar4 + 1;
        pauVar6 = pauVar6 + 1;
      }
      for (; iVar7 + 7 < iVar5; iVar7 = iVar7 + 8) {
        auVar10._0_4_ = fVar11 * *(float *)*pauVar4;
        auVar10._4_4_ = fVar11 * *(float *)(*pauVar4 + 4);
        auVar10._8_4_ = fVar11 * *(float *)(*pauVar4 + 8);
        auVar10._12_4_ = fVar11 * *(float *)(*pauVar4 + 0xc);
        auVar10._16_4_ = fVar11 * *(float *)(*pauVar4 + 0x10);
        auVar10._20_4_ = fVar11 * *(float *)(*pauVar4 + 0x14);
        auVar10._28_36_ = in_ZMM3._28_36_;
        auVar10._24_4_ = fVar11 * *(float *)(*pauVar4 + 0x18);
        in_ZMM3 = ZEXT3264(auVar10._0_32_);
        *(undefined1 (*) [32])*pauVar6 = auVar10._0_32_;
        pauVar4 = (undefined1 (*) [64])(*pauVar4 + 0x20);
        pauVar6 = (undefined1 (*) [64])((long)*pauVar6 + 0x20);
      }
      for (; iVar7 + 3 < iVar5; iVar7 = iVar7 + 4) {
        auVar12._0_4_ = fVar11 * *(float *)*pauVar4;
        auVar12._4_4_ = fVar11 * *(float *)(*pauVar4 + 4);
        auVar12._8_4_ = fVar11 * *(float *)(*pauVar4 + 8);
        auVar12._12_4_ = fVar11 * *(float *)(*pauVar4 + 0xc);
        in_ZMM3 = ZEXT1664(auVar12);
        *(undefined1 (*) [16])*pauVar6 = auVar12;
        pauVar4 = (undefined1 (*) [64])(*pauVar4 + 0x10);
        pauVar6 = (undefined1 (*) [64])((long)*pauVar6 + 0x10);
      }
      lVar8 = 0;
      for (; iVar7 < iVar5; iVar7 = iVar7 + 1) {
        *(float *)((long)*pauVar6 + lVar8) = fVar11 * *(float *)(*pauVar4 + lVar8);
        lVar8 = lVar8 + 4;
      }
    }
  }
  return iVar2;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}